

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-visuals.c
# Opt level: O3

visuals_color_cycle *
visuals_cycler_cycle_by_name(visuals_cycler *cycler,char *group_name,char *cycle_name)

{
  size_t sVar1;
  visuals_cycle_group **ppvVar2;
  visuals_cycle_group *pvVar3;
  visuals_color_cycle **ppvVar4;
  visuals_color_cycle *pvVar5;
  int iVar6;
  size_t sVar7;
  
  if (group_name != (char *)0x0) {
    if (cycle_name == (char *)0x0) {
      return (visuals_color_cycle *)0x0;
    }
    if (*group_name == '\0') {
      return (visuals_color_cycle *)0x0;
    }
    if ((*cycle_name != '\0') && (sVar1 = cycler->max_groups, sVar1 != 0)) {
      ppvVar2 = cycler->groups;
      sVar7 = 0;
      while( true ) {
        pvVar3 = ppvVar2[sVar7];
        iVar6 = strcmp(pvVar3->group_name,group_name);
        if (iVar6 == 0) break;
        sVar7 = sVar7 + 1;
        if (sVar1 == sVar7) {
          return (visuals_color_cycle *)0x0;
        }
      }
      sVar1 = pvVar3->max_cycles;
      if (sVar1 != 0) {
        ppvVar4 = pvVar3->cycles;
        sVar7 = 0;
        do {
          pvVar5 = ppvVar4[sVar7];
          iVar6 = strcmp(pvVar5->cycle_name,cycle_name);
          if (iVar6 == 0) {
            return pvVar5;
          }
          sVar7 = sVar7 + 1;
        } while (sVar1 != sVar7);
        return (visuals_color_cycle *)0x0;
      }
    }
  }
  return (visuals_color_cycle *)0x0;
}

Assistant:

static struct visuals_color_cycle *visuals_cycler_cycle_by_name(struct visuals_cycler const *cycler,
																const char *group_name,
																const char *cycle_name)
{
	struct visuals_cycle_group *group = NULL;
	struct visuals_color_cycle *cycle = NULL;
	size_t i = 0;

	if (group_name == NULL || strlen(group_name) == 0) {
		return NULL;
	}

	if (cycle_name == NULL || strlen(cycle_name) == 0) {
		return NULL;
	}

	for (i = 0; i < cycler->max_groups; i++) {
		if (streq(cycler->groups[i]->group_name, group_name)) {
			group = cycler->groups[i];
			break;
		}
	}

	if (group == NULL) {
		return NULL;
	}

	for (i = 0; i < group->max_cycles; i++) {
		if (streq(group->cycles[i]->cycle_name, cycle_name)) {
			cycle = group->cycles[i];
			break;
		}
	}

	return cycle;
}